

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

bool duckdb_yyjson::unsafe_yyjson_mut_equals(yyjson_mut_val *lhs,yyjson_mut_val *rhs)

{
  yyjson_mut_val *lhs_00;
  yyjson_mut_val *pyVar1;
  void *__s2;
  int iVar2;
  uint64_t uVar3;
  byte bVar4;
  byte bVar5;
  yyjson_val_uni *pyVar6;
  ulong uVar7;
  ulong uVar8;
  yyjson_mut_val *cur;
  ulong *puVar9;
  yyjson_val_uni *pyVar10;
  ulong __n;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  uVar7 = lhs->tag;
  bVar4 = (byte)uVar7 & 7;
  uVar8 = rhs->tag;
  if (bVar4 == ((byte)uVar8 & 7)) {
    switch(bVar4) {
    case 0:
      break;
    default:
      if (uVar7 >> 8 == uVar8 >> 8) {
        iVar2 = bcmp((lhs->uni).ptr,(rhs->uni).ptr,uVar7 >> 8);
        return iVar2 == 0;
      }
      break;
    case 2:
    case 3:
      return uVar7 == uVar8;
    case 4:
      bVar5 = (byte)uVar7 & 0x18;
      bVar4 = (byte)uVar8 & 0x18;
      if (bVar5 == bVar4) {
        uVar3 = (lhs->uni).u64;
LAB_01b84f2b:
        return uVar3 == (rhs->uni).u64;
      }
      if (bVar5 == 8 && (uVar8 & 0x18) == 0) {
        uVar3 = (lhs->uni).i64;
        if (-1 < (long)uVar3) goto LAB_01b84f2b;
      }
      else if (((uVar7 & 0x18) == 0 && bVar4 == 8) && (-1 < (rhs->uni).i64)) {
        return (lhs->uni).u64 == (rhs->uni).i64;
      }
      break;
    case 6:
      uVar11 = uVar7 >> 8;
      if (uVar11 == uVar8 >> 8) {
        if (uVar7 < 0x100) {
          return true;
        }
        pyVar6 = &lhs->uni;
        pyVar10 = &rhs->uni;
        while( true ) {
          bVar12 = uVar11 == 0;
          uVar11 = uVar11 - 1;
          if (bVar12) {
            return bVar12;
          }
          pyVar1 = (yyjson_mut_val *)pyVar10->str;
          lhs_00 = (yyjson_mut_val *)pyVar6->str;
          bVar13 = unsafe_yyjson_mut_equals(lhs_00,pyVar1);
          if (!bVar13) break;
          pyVar6 = (yyjson_val_uni *)&lhs_00->next;
          pyVar10 = (yyjson_val_uni *)&pyVar1->next;
        }
        return bVar12;
      }
      break;
    case 7:
      uVar11 = uVar7 >> 8;
      if (uVar11 == uVar8 >> 8) {
        if (0xff < uVar7) {
          puVar9 = (ulong *)0x0;
          uVar7 = 0;
          if (0xff < uVar8) {
            puVar9 = (ulong *)(rhs->uni).u64;
            uVar7 = uVar11;
          }
          pyVar6 = &lhs->uni;
          while( true ) {
            bVar12 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar12) break;
            pyVar1 = (yyjson_mut_val *)pyVar6->str;
            __s2 = (pyVar1->uni).ptr;
            if (__s2 == (void *)0x0) {
              return false;
            }
            __n = pyVar1->tag >> 8;
            uVar8 = uVar7;
            do {
              bVar13 = uVar8 == 0;
              uVar8 = uVar8 - 1;
              if (bVar13) {
                return false;
              }
              puVar9 = *(ulong **)(puVar9[2] + 0x10);
            } while ((*puVar9 >> 8 != __n) || (iVar2 = bcmp((void *)puVar9[1],__s2,__n), iVar2 != 0)
                    );
            if ((yyjson_mut_val *)puVar9[2] == (yyjson_mut_val *)0x0) {
              return bVar12;
            }
            pyVar1 = pyVar1->next;
            bVar13 = unsafe_yyjson_mut_equals(pyVar1,(yyjson_mut_val *)puVar9[2]);
            pyVar6 = (yyjson_val_uni *)&pyVar1->next;
            if (!bVar13) {
              return bVar12;
            }
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool unsafe_yyjson_mut_equals(yyjson_mut_val *lhs, yyjson_mut_val *rhs) {
    yyjson_type type = unsafe_yyjson_get_type(lhs);
    if (type != unsafe_yyjson_get_type(rhs)) return false;

    switch (type) {
        case YYJSON_TYPE_OBJ: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                yyjson_mut_obj_iter iter;
                yyjson_mut_obj_iter_init(rhs, &iter);
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                while (len-- > 0) {
                    rhs = yyjson_mut_obj_iter_getn(&iter, lhs->uni.str,
                                                   unsafe_yyjson_get_len(lhs));
                    if (!rhs) return false;
                    if (!unsafe_yyjson_mut_equals(lhs->next, rhs)) return false;
                    lhs = lhs->next->next;
                }
            }
            /* yyjson allows duplicate keys, so the check may be inaccurate */
            return true;
        }

        case YYJSON_TYPE_ARR: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                rhs = (yyjson_mut_val *)rhs->uni.ptr;
                while (len-- > 0) {
                    if (!unsafe_yyjson_mut_equals(lhs, rhs)) return false;
                    lhs = lhs->next;
                    rhs = rhs->next;
                }
            }
            return true;
        }

        case YYJSON_TYPE_NUM:
            return unsafe_yyjson_num_equals(lhs, rhs);

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR:
            return unsafe_yyjson_str_equals(lhs, rhs);

        case YYJSON_TYPE_NULL:
        case YYJSON_TYPE_BOOL:
            return lhs->tag == rhs->tag;

        default:
            return false;
    }
}